

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::DTDScanner::checkForPERef(DTDScanner *this,bool inLiteral,bool inMarkup)

{
  bool bVar1;
  bool local_1b;
  bool gotSpace;
  bool inMarkup_local;
  bool inLiteral_local;
  DTDScanner *this_local;
  
  local_1b = ReaderMgr::skippedSpace(this->fReaderMgr);
  if (local_1b) {
    ReaderMgr::skipPastSpaces(this->fReaderMgr);
  }
  bVar1 = ReaderMgr::skippedChar(this->fReaderMgr,L'%');
  this_local._7_1_ = local_1b;
  if (bVar1) {
    do {
      bVar1 = expandPERef(this,false,inLiteral,inMarkup,false);
      if (!bVar1) {
        XMLScanner::emitError(this->fScanner,ExpectedEntityRefName);
      }
      bVar1 = ReaderMgr::skippedSpace(this->fReaderMgr);
      if (bVar1) {
        ReaderMgr::skipPastSpaces(this->fReaderMgr);
        local_1b = true;
      }
      bVar1 = ReaderMgr::skippedChar(this->fReaderMgr,L'%');
    } while (bVar1);
    this_local._7_1_ = local_1b;
  }
  return this_local._7_1_;
}

Assistant:

bool DTDScanner::checkForPERef(   const bool    inLiteral
                                , const bool    inMarkup)
{
    bool gotSpace = false;

    //
    //  See if we have any spaces up front. If so, then skip them and set
    //  the gotSpaces flag.
    //
    if (fReaderMgr->skippedSpace())
    {
        fReaderMgr->skipPastSpaces();
        gotSpace = true;
    }

    // If the next char is a percent, then expand the PERef
    if (!fReaderMgr->skippedChar(chPercent))
       return gotSpace;

    while (true)
    {
       if (!expandPERef(false, inLiteral, inMarkup, false))
          fScanner->emitError(XMLErrs::ExpectedEntityRefName);
       // And skip any more spaces in the expanded value
       if (fReaderMgr->skippedSpace())
       {
          fReaderMgr->skipPastSpaces();
          gotSpace = true;
       }
       if (!fReaderMgr->skippedChar(chPercent))
          break;
    }
    return gotSpace;
}